

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  element_type *peVar1;
  element_type *this_00;
  vector<std::thread,_std::allocator<std::thread>_> *this_01;
  __int_type _Var2;
  long in_RDI;
  float fVar3;
  ostream *in_stack_00000010;
  real in_stack_00000018;
  real in_stack_0000001c;
  FastText *in_stack_00000020;
  int32_t i_1;
  real progress;
  int64_t ntokens;
  int32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined4 in_stack_ffffffffffffff58;
  float in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  __atomic_base<long> *in_stack_ffffffffffffff68;
  __atomic_base<long> *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  float in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar5;
  duration<long,std::ratio<1l,1000l>> local_68 [8];
  vector<std::thread,_std::allocator<std::thread>_> *local_60;
  int local_40;
  int local_2c;
  vector<std::thread,_std::allocator<std::thread>_> local_28;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(in_RDI + 0x90) = local_10;
  std::__atomic_base<long>::operator=
            (in_stack_ffffffffffffff70,(__int_type)in_stack_ffffffffffffff68);
  std::atomic<float>::operator=
            ((atomic<float> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             in_stack_ffffffffffffff5c);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x163533);
  for (local_2c = 0; iVar5 = local_2c,
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x16354d), iVar5 < peVar1->thread; local_2c = local_2c + 1) {
    local_40 = local_2c;
    std::thread::thread<fasttext::FastText::startThreads()::__0,,void>
              ((thread *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
               (value_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::thread::~thread((thread *)0x16359d);
  }
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1635e8);
  this_01 = (vector<std::thread,_std::allocator<std::thread>_> *)Dictionary::ntokens(this_00);
  local_60 = this_01;
  while( true ) {
    in_stack_ffffffffffffff68 =
         (__atomic_base<long> *)std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff68)
    ;
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x163621);
    if ((long)peVar1->epoch * (long)local_60 <= (long)in_stack_ffffffffffffff68) break;
    iVar5 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
              (local_68,(int *)&stack0xffffffffffffff94);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
              ((duration<long,_std::ratio<1L,_1000L>_> *)CONCAT44(iVar5,in_stack_ffffffffffffff90));
    fVar3 = std::atomic::operator_cast_to_float((atomic<float> *)0x163672);
    if ((0.0 <= fVar3) &&
       (peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16368a), 1 < peVar1->verbose)) {
      _Var2 = std::__atomic_base::operator_cast_to_long(in_stack_ffffffffffffff68);
      in_stack_ffffffffffffff90 = (float)_Var2;
      peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1636ba);
      in_stack_ffffffffffffff90 =
           in_stack_ffffffffffffff90 / (float)((long)peVar1->epoch * (long)local_60);
      std::operator<<((ostream *)&std::cerr,"\r");
      std::atomic::operator_cast_to_float((atomic<float> *)0x16370e);
      printInfo(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
    }
  }
  iVar5 = 0;
  while (iVar4 = iVar5,
        peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16374c), iVar5 < peVar1->thread) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_28,(long)iVar4);
    std::thread::join();
    iVar5 = iVar4 + 1;
  }
  peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x163790);
  if (0 < peVar1->verbose) {
    std::operator<<((ostream *)&std::cerr,"\r");
    std::atomic::operator_cast_to_float((atomic<float> *)0x1637bf);
    printInfo(in_stack_00000020,in_stack_0000001c,in_stack_00000018,in_stack_00000010);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(this_01);
  return;
}

Assistant:

void FastText::startThreads() {
	start_ = std::chrono::steady_clock::now();
	tokenCount_ = 0;
	loss_ = -1;
	std::vector<std::thread> threads;
	for (int32_t i = 0; i < args_->thread; i++) {
		threads.push_back(std::thread([=]() { trainThread(i); }));
	}
	const int64_t ntokens = dict_->ntokens();
	// Same condition as trainThread
	while (tokenCount_ < args_->epoch * ntokens) {
		std::this_thread::sleep_for(std::chrono::milliseconds(100));
		if (loss_ >= 0 && args_->verbose > 1) {
			real progress = real(tokenCount_) / (args_->epoch * ntokens);
			std::cerr << "\r";
			printInfo(progress, loss_, std::cerr);
		}
	}
	for (int32_t i = 0; i < args_->thread; i++) {
		threads[i].join();
	}
	if (args_->verbose > 0) {
		std::cerr << "\r";
		printInfo(1.0, loss_, std::cerr);
		std::cerr << std::endl;
	}
}